

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

vector<RPCArg,_std::allocator<RPCArg>_> * wallet::OutputsDoc(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff608;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  Optional *in_stack_fffffffffffff610;
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_fffffffffffff618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff620;
  allocator_type *in_stack_fffffffffffff640;
  allocator<char> *in_stack_fffffffffffff648;
  iterator in_stack_fffffffffffff650;
  RPCArgOptions *in_stack_fffffffffffff658;
  string *in_stack_fffffffffffff660;
  Fallback *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  Type in_stack_fffffffffffff674;
  string *in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff680;
  Type in_stack_fffffffffffff684;
  string *in_stack_fffffffffffff688;
  RPCArg *in_stack_fffffffffffff690;
  undefined1 *local_960;
  RPCArgOptions *in_stack_fffffffffffff6b0;
  undefined1 *puVar1;
  undefined1 *local_948;
  long *local_930;
  allocator<char> local_849;
  undefined4 local_848;
  allocator<char> local_841 [32];
  allocator<char> local_821;
  undefined4 local_820;
  allocator<char> local_81a [2];
  undefined4 local_818;
  allocator<char> local_811 [32];
  allocator<char> local_7f1;
  undefined4 local_7f0;
  allocator<char> local_7e9;
  RPCArg local_7e8;
  undefined1 local_6b8 [264];
  undefined1 local_5b0 [160];
  allocator<RPCArg> local_510 [40];
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0;
  undefined1 local_4cf;
  undefined1 local_4c8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined1 local_488;
  undefined1 local_487;
  undefined1 local_3c0 [264];
  undefined1 local_2b8 [160];
  long local_218 [66];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_7f0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_818 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  std::operator+(&in_stack_fffffffffffff658->skip_type_check,&in_stack_fffffffffffff650->m_names);
  std::operator+(in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
  local_4c8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff620);
  local_4a0 = 0;
  uStack_498 = 0;
  local_490 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff608);
  local_488 = 0;
  local_487 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 in_stack_fffffffffffff678,in_stack_fffffffffffff674,in_stack_fffffffffffff668,
                 in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff608);
  __l._M_len = (size_type)in_stack_fffffffffffff658;
  __l._M_array = in_stack_fffffffffffff650;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff648,__l,
             in_stack_fffffffffffff640);
  local_510[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff620);
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4d8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff608);
  local_4d0 = 0;
  local_4cf = 0;
  this = local_510;
  RPCArg::RPCArg(in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff684,
                 (Fallback *)in_stack_fffffffffffff678,
                 (string *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff668,
                 in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_820 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_848 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_1_ = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff620);
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = 0;
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = 0;
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_1_ = 0;
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _73_1_ = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 in_stack_fffffffffffff678,in_stack_fffffffffffff674,in_stack_fffffffffffff668,
                 in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_fffffffffffff658;
  __l_00._M_array = in_stack_fffffffffffff650;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff648,__l_00,
             in_stack_fffffffffffff640);
  local_7e8.m_names._M_dataplus._M_p._0_1_ = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff620);
  local_7e8.m_inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.m_inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7e8.m_inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = 0;
  local_7e8.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._1_1_ = 0;
  this_00 = &local_7e8;
  RPCArg::RPCArg(in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff684,
                 (Fallback *)in_stack_fffffffffffff678,
                 (string *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff668,
                 in_stack_fffffffffffff6b0);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)this_00);
  __l_01._M_len = (size_type)in_stack_fffffffffffff658;
  __l_01._M_array = in_stack_fffffffffffff650;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff648,__l_01,
             in_stack_fffffffffffff640);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_930 = &local_8;
  do {
    local_930 = local_930 + -0x21;
    RPCArg::~RPCArg(this_00);
  } while (local_930 != local_218);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff618);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar1 = local_6b8;
  local_948 = local_5b0;
  do {
    local_948 = local_948 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_948 != puVar1);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_849);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_841);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_821);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_81a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff618);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_960 = local_2b8;
  do {
    local_960 = local_960 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_960 != local_3c0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_811);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_7f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_7e9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> OutputsDoc()
{
    return
    {
        {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
            {
                {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address,\n"
                         "the value (float or string) is the amount in " + CURRENCY_UNIT + ""},
            },
        },
        {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
            {
                {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "A key-value pair. The key must be \"data\", the value is hex-encoded data"},
            },
        },
    };
}